

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O0

unsigned_long __thiscall MeCab::Param::get<unsigned_long>(Param *this,char *key)

{
  bool bVar1;
  unsigned_long *puVar2;
  pointer ppVar3;
  char *in_RSI;
  scoped_ptr<unsigned_long> r;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000118;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff28;
  scoped_ptr<unsigned_long> *in_stack_ffffffffffffff30;
  string local_90 [32];
  scoped_ptr<unsigned_long> local_70;
  _Self local_60 [3];
  allocator local_41;
  string local_40 [32];
  _Self local_20 [3];
  unsigned_long local_8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RSI,&local_41);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x156d37);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::operator==(local_20,local_60);
  if (bVar1) {
    puVar2 = (unsigned_long *)operator_new(8);
    *puVar2 = 0;
    scoped_ptr<unsigned_long>::scoped_ptr(&local_70,puVar2);
    puVar2 = scoped_ptr<unsigned_long>::operator*(&local_70);
    local_8 = *puVar2;
    scoped_ptr<unsigned_long>::~scoped_ptr(in_stack_ffffffffffffff30);
  }
  else {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x156e5c);
    std::__cxx11::string::string(local_90,(string *)&ppVar3->second);
    local_8 = ::(anonymous_namespace)::lexical_cast<unsigned_long,std::__cxx11::string>
                        (in_stack_00000118);
    std::__cxx11::string::~string(local_90);
  }
  return local_8;
}

Assistant:

T get(const char *key) const {
    std::map<std::string, std::string>::const_iterator it = conf_.find(key);
    if (it == conf_.end()) {
      scoped_ptr<T> r(new T());
      return *r;
    }
    return lexical_cast<T, std::string>(it->second);
  }